

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall
crnlib::crn_comp::pack_color_endpoints
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  int *piVar1;
  undefined4 uVar2;
  uint *puVar3;
  unsigned_short *puVar4;
  uchar *puVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  color_quad_u8 cVar14;
  int iVar15;
  uint uVar16;
  undefined8 uVar17;
  bool bVar18;
  symbol_codec *psVar19;
  bool bVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  undefined8 *puVar25;
  static_huffman_data_model *this_00;
  color_quad_u8 prev [2];
  vector<unsigned_int> residual_syms;
  symbol_histogram hist [2];
  vector<unsigned_int> remapped_endpoints;
  color_quad_u8 cur [2];
  undefined1 local_1b0 [5];
  undefined1 uStack_1ab;
  undefined1 uStack_1aa;
  undefined1 uStack_1a9;
  vector<unsigned_int> local_1a8;
  undefined8 uStack_198;
  uint local_18c;
  elemental_vector local_188;
  elemental_vector local_178;
  elemental_vector local_168;
  vector<unsigned_char> *local_150;
  crn_comp *local_148;
  ulong local_140;
  static_huffman_data_model local_138 [2];
  symbol_codec local_c8;
  
  uVar16 = (this->m_color_endpoints).m_size;
  local_168.m_p = (void *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  local_150 = packed_data;
  if (uVar16 != 0) {
    elemental_vector::increase_capacity(&local_168,uVar16,uVar16 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_168._8_8_ & 0xffffffff) * 4 + (long)local_168.m_p),0,
           (ulong)(uVar16 - local_168.m_size) << 2);
    local_168.m_size = uVar16;
    if ((this->m_color_endpoints).m_size != 0) {
      puVar3 = (this->m_color_endpoints).m_p;
      puVar4 = remapping->m_p;
      uVar22 = 0;
      do {
        *(uint *)((long)local_168.m_p + (ulong)puVar4[uVar22] * 4) = puVar3[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar22 < (this->m_color_endpoints).m_size);
    }
  }
  local_178.m_p = (void *)0x0;
  local_178.m_size = 0;
  local_178.m_capacity = 0;
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  elemental_vector::increase_capacity(&local_188,0x20,false,4,(object_mover)0x0,false);
  memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
         (ulong)(0x20 - local_188.m_size) << 2);
  local_188.m_size = 0x20;
  if (local_178.m_size != 0x40) {
    if (local_178.m_size < 0x41) {
      if (local_178.m_capacity < 0x40) {
        elemental_vector::increase_capacity
                  (&local_178,0x40,local_178.m_size == 0x3f,4,(object_mover)0x0,false);
      }
      memset((void *)((ulong)local_178.m_size * 4 + (long)local_178.m_p),0,
             (ulong)(0x40 - local_178.m_size) << 2);
    }
    local_178.m_size = 0x40;
  }
  local_1a8.m_p = (uint *)0x0;
  local_1a8.m_size = 0;
  local_1a8.m_capacity = 0;
  vector<unsigned_int>::reserve(&local_1a8,(this->m_color_endpoints).m_size * 6);
  _local_1b0 = 0;
  if ((this->m_color_endpoints).m_size != 0) {
    uVar22 = 0;
    local_148 = this;
    do {
      uVar2 = *(undefined4 *)((long)local_168.m_p + uVar22 * 4);
      dxt1_block::unpack_color((dxt1_block *)local_138,(uint16)uVar2,false,0xff);
      uVar12 = local_138[0].m_total_syms._3_1_;
      uVar10 = local_138[0].m_total_syms._2_1_;
      uVar8 = local_138[0].m_total_syms._1_1_;
      uVar6 = (undefined1)local_138[0].m_total_syms;
      local_c8.m_pDecode_buf._0_1_ = (undefined1)local_138[0].m_total_syms;
      local_c8.m_pDecode_buf._1_1_ = local_138[0].m_total_syms._1_1_;
      local_c8.m_pDecode_buf._2_1_ = local_138[0].m_total_syms._2_1_;
      local_c8.m_pDecode_buf._3_1_ = local_138[0].m_total_syms._3_1_;
      local_140 = uVar22;
      cVar14 = dxt1_block::unpack_color
                         ((dxt1_block *)local_138,(uint16)((uint)uVar2 >> 0x10),false,0xff);
      uVar13 = local_138[0].m_total_syms._3_1_;
      uVar11 = local_138[0].m_total_syms._2_1_;
      uVar9 = local_138[0].m_total_syms._1_1_;
      uVar7 = (undefined1)local_138[0].m_total_syms;
      local_c8.m_pDecode_buf._4_1_ = (undefined1)local_138[0].m_total_syms;
      local_c8.m_pDecode_buf._5_1_ = local_138[0].m_total_syms._1_1_;
      local_c8.m_pDecode_buf._6_1_ = local_138[0].m_total_syms._2_1_;
      local_c8.m_pDecode_buf._7_1_ = local_138[0].m_total_syms._3_1_;
      uVar17 = CONCAT71((uint7)cVar14.field_0._1_3_,1);
      psVar19 = &local_c8;
      puVar25 = (undefined8 *)local_1b0;
      lVar23 = 0;
      do {
        local_18c = (uint)uVar17;
        lVar21 = 0;
        do {
          uVar24 = (uint)*(byte *)((long)&psVar19->m_pDecode_buf + lVar21) -
                   (uint)*(byte *)((long)puVar25 + lVar21) & (&DAT_001b0300)[lVar21 + lVar23];
          piVar1 = (int *)((long)(&local_188)[lVar21 == 1].m_p + (ulong)uVar24 * 4);
          *piVar1 = *piVar1 + 1;
          if (local_1a8.m_capacity <= local_1a8.m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_1a8,local_1a8.m_size + 1,true,4,(object_mover)0x0,
                       false);
          }
          local_1a8.m_p[local_1a8.m_size] = uVar24;
          local_1a8.m_size = local_1a8.m_size + 1;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        lVar23 = 3;
        psVar19 = (symbol_codec *)((long)&local_c8.m_pDecode_buf + 4);
        puVar25 = (undefined8 *)((long)local_1b0 + 4);
        uVar17 = 0;
      } while ((local_18c & 1) != 0);
      _local_1b0 = CONCAT17(uVar13,CONCAT16(uVar11,CONCAT15(uVar9,CONCAT14(uVar7,CONCAT13(uVar12,
                                                  CONCAT12(uVar10,CONCAT11(uVar8,uVar6)))))));
      uVar22 = local_140 + 1;
    } while (uVar22 < (local_148->m_color_endpoints).m_size);
  }
  static_huffman_data_model::static_huffman_data_model(local_138);
  static_huffman_data_model::static_huffman_data_model(local_138 + 1);
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x100000);
  this_00 = local_138;
  bVar18 = true;
  do {
    bVar20 = bVar18;
    iVar15 = static_huffman_data_model::init(this_00,(EVP_PKEY_CTX *)0x1);
    if ((char)iVar15 == '\0') {
LAB_001656f2:
      bVar18 = false;
      goto LAB_001656f4;
    }
    uVar16 = symbol_codec::encode_transmit_static_huffman_data_model
                       (&local_c8,this_00,false,(static_huffman_data_model *)0x0);
    if (uVar16 == 0) goto LAB_001656f2;
    this_00 = local_138 + 1;
    bVar18 = false;
  } while (bVar20);
  if (local_1a8.m_size != 0) {
    iVar15 = 1;
    uVar22 = 0;
    do {
      symbol_codec::encode
                (&local_c8,local_1a8.m_p[uVar22],
                 local_138 + ((int)((uVar22 & 0xffffffff) / 3) * 3 + iVar15 == 0));
      uVar22 = uVar22 + 1;
      iVar15 = iVar15 + -1;
    } while (uVar22 < local_1a8.m_size);
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar5 = local_150->m_p;
  local_150->m_p = local_c8.m_output_buf.m_p;
  uVar17._0_4_ = local_150->m_size;
  uVar17._4_4_ = local_150->m_capacity;
  local_150->m_size = local_c8.m_output_buf.m_size;
  local_150->m_capacity = local_c8.m_output_buf.m_capacity;
  bVar18 = true;
  local_c8.m_output_buf.m_p = puVar5;
  local_c8.m_output_buf._8_8_ = uVar17;
LAB_001656f4:
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  lVar23 = 0x38;
  do {
    static_huffman_data_model::~static_huffman_data_model
              ((static_huffman_data_model *)((long)&local_138[0].m_total_syms + lVar23));
    lVar23 = lVar23 + -0x38;
  } while (lVar23 != -0x38);
  if (local_1a8.m_p != (uint *)0x0) {
    crnlib_free(local_1a8.m_p);
  }
  lVar23 = 0x20;
  do {
    if (*(void **)((long)&uStack_198 + lVar23) != (void *)0x0) {
      crnlib_free(*(void **)((long)&uStack_198 + lVar23));
    }
    lVar23 = lVar23 + -0x10;
  } while (lVar23 != 0);
  if (local_168.m_p != (void *)0x0) {
    crnlib_free(local_168.m_p);
  }
  return bVar18;
}

Assistant:

bool crn_comp::pack_color_endpoints(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint> remapped_endpoints(m_color_endpoints.size());

        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = m_color_endpoints[i];
        }

        const uint component_limits[6] = { 31, 63, 31, 31, 63, 31 };

        symbol_histogram hist[2];
        hist[0].resize(32);
        hist[1].resize(64);

        crnlib::vector<uint> residual_syms;
        residual_syms.reserve(m_color_endpoints.size() * 2 * 3);

        color_quad_u8 prev[2];
        prev[0].clear();
        prev[1].clear();

        int total_residuals = 0;

        for (uint endpoint_index = 0; endpoint_index < m_color_endpoints.size(); endpoint_index++)
        {
            const uint endpoint = remapped_endpoints[endpoint_index];

            color_quad_u8 cur[2];
            cur[0] = dxt1_block::unpack_color((uint16)(endpoint & 0xFFFF), false);
            cur[1] = dxt1_block::unpack_color((uint16)((endpoint >> 16) & 0xFFFF), false);

            for (uint j = 0; j < 2; j++)
            {
                for (uint k = 0; k < 3; k++)
                {
                    int delta = cur[j][k] - prev[j][k];
                    total_residuals += delta * delta;
                    int sym = delta & component_limits[j * 3 + k];
                    int table = (k == 1) ? 1 : 0;
                    hist[table].inc_freq(sym);
                    residual_syms.push_back(sym);
                }
            }

            prev[0] = cur[0];
            prev[1] = cur[1];
        }

        static_huffman_data_model residual_dm[2];

        symbol_codec codec;
        codec.start_encoding(1024 * 1024);

        // Transmit residuals
        for (uint i = 0; i < 2; i++)
        {
            if (!residual_dm[i].init(true, hist[i], 15))
            {
                return false;
            }

            if (!codec.encode_transmit_static_huffman_data_model(residual_dm[i], false))
            {
                return false;
            }
        }

        for (uint i = 0; i < residual_syms.size(); i++)
        {
            const uint sym = residual_syms[i];
            const uint table = ((i % 3) == 1) ? 1 : 0;
            codec.encode(sym, residual_dm[table]);
        }

        codec.stop_encoding(false);

        packed_data.swap(codec.get_encoding_buf());

        return true;
    }